

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O3

void __thiscall
QHexView::setMetadataSize
          (QHexView *this,qint64 begin,qint64 length,QColor *fgcolor,QColor *bgcolor,
          QString *comment)

{
  QHexMetadata *this_00;
  undefined8 uVar1;
  QHexMetadataItem local_58;
  
  this_00 = this->m_hexmetadata;
  local_58.end = length + begin;
  local_58.foreground.ct._4_6_ =
       (undefined6)((ulong)*(undefined8 *)((long)&fgcolor->ct + 2) >> 0x10);
  local_58.foreground._0_6_ = SUB86(*(undefined8 *)fgcolor,0);
  local_58.foreground.ct.argb.red = (ushort)((ulong)*(undefined8 *)fgcolor >> 0x30);
  uVar1 = *(undefined8 *)((long)&bgcolor->ct + 2);
  local_58.background._0_6_ = SUB86(*(undefined8 *)bgcolor,0);
  local_58.background.ct.argb.red = (ushort)uVar1;
  local_58.background.ct._4_6_ = (undefined6)((ulong)uVar1 >> 0x10);
  local_58.comment.d.d = (comment->d).d;
  local_58.comment.d.ptr = (comment->d).ptr;
  local_58.comment.d.size = (comment->d).size;
  if (&(local_58.comment.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.comment.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.comment.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.begin = begin;
  QHexMetadata::setMetadata(this_00,&local_58);
  if (&(local_58.comment.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_58.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_58.comment.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void QHexView::setMetadataSize(qint64 begin, qint64 length,
                               const QColor& fgcolor, const QColor& bgcolor,
                               const QString& comment) {
    m_hexmetadata->setMetadataSize(begin, length, fgcolor, bgcolor, comment);
}